

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O1

void __thiscall
m2d::savanna::ssl_reuse::
http_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::on_read_l(http_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
            *this,error_code ec,size_t bytes_transferred)

{
  element_type *peVar1;
  delegate<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  *pdVar2;
  node_ptr plVar3;
  int iVar4;
  bool bVar5;
  undefined8 local_1d8;
  error_category *local_1d0;
  error_condition local_1c8;
  message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  local_1b8;
  optional_base<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  local_110;
  char local_60;
  system_error local_58;
  
  local_1d0 = ec.cat_;
  local_1d8._4_1_ = ec.failed_;
  bVar5 = (bool)local_1d8._4_1_ == true;
  local_1d8 = ec._0_8_;
  if (bVar5) {
    boost::system::error_condition::error_condition<boost::system::errc::errc_t>
              (&local_1c8,not_connected,(type *)0x0);
    iVar4 = (*local_1d0->_vptr_error_category[2])(local_1d0,local_1d8 & 0xffffffff,&local_1c8);
    if (((char)iVar4 == '\0') &&
       (iVar4 = (*(local_1c8.cat_)->_vptr_error_category[3])
                          (local_1c8.cat_,&local_1d8,(ulong)(uint)local_1c8.val_),
       (char)iVar4 == '\0')) {
      (*(this->super_interface)._vptr_interface[8])(this,local_1d8,local_1d0);
    }
  }
  peVar1 = (((this->tcp_stream_).
             super___shared_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->impl_).px;
  if (peVar1 != (element_type *)0x0) {
    boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::shutdown
              ((peVar1->socket).
               super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               .impl_.service_,(int)peVar1 + 0x18,2);
    if (local_1d8._4_1_ == '\x01') {
      boost::system::error_condition::error_condition<boost::system::errc::errc_t>
                (&local_1c8,not_connected,(type *)0x0);
      iVar4 = (*local_1d0->_vptr_error_category[2])(local_1d0,local_1d8 & 0xffffffff,&local_1c8);
      if (((char)iVar4 == '\0') &&
         (iVar4 = (*(local_1c8.cat_)->_vptr_error_category[3])
                            (local_1c8.cat_,&local_1d8,(ulong)(uint)local_1c8.val_),
         (char)iVar4 == '\0')) {
        (*(this->super_interface)._vptr_interface[8])(this,local_1d8,local_1d0);
        return;
      }
    }
    pdVar2 = this->delegate_;
    if (pdVar2 != (delegate<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
                   *)0x0) {
      boost::beast::http::basic_fields<std::allocator<char>_>::basic_fields
                ((basic_fields<std::allocator<char>_> *)&local_1b8,
                 (basic_fields<std::allocator<char>_> *)&this->response_);
      local_1b8.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
      version_ = (this->response_).
                 super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
                 version_;
      local_1b8.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
      result_ = (this->response_).
                super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
                result_;
      boost::beast::basic_multi_buffer<std::allocator<char>_>::basic_multi_buffer
                (&local_1b8.
                  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                  .value_,&(this->response_).
                           super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                           .value_);
      local_110.m_initialized = false;
      boost::beast::http::
      message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
      ::message((message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                 *)&local_110.m_storage,&local_1b8);
      local_110.m_initialized = true;
      local_60 = '\0';
      (**pdVar2->_vptr_delegate)(pdVar2);
      if (local_60 == '\x01') {
        boost::system::system_error::~system_error(&local_58);
        local_60 = '\0';
      }
      boost::optional_detail::
      optional_base<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
      ::~optional_base(&local_110);
      while (local_1b8.
             super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.
             value_.list_.data_.root_plus_size_.m_header.super_node.next_ !=
             &local_1b8.
              super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.
              value_.list_.data_.root_plus_size_.m_header.super_node) {
        plVar3 = (local_1b8.
                  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                  .value_.list_.data_.root_plus_size_.m_header.super_node.next_)->next_;
        operator_delete(local_1b8.
                        super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                        .value_.list_.data_.root_plus_size_.m_header.super_node.next_);
        local_1b8.
        super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.value_
        .list_.data_.root_plus_size_.m_header.super_node.next_ = plVar3;
      }
      boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
                ((basic_fields<std::allocator<char>_> *)&local_1b8);
    }
    return;
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::beast::basic_stream<boost::asio::ip::tcp>::impl_type>::operator->() const [T = boost::beast::basic_stream<boost::asio::ip::tcp>::impl_type]"
               );
}

Assistant:

void on_read_l(beast::error_code ec, std::size_t bytes_transferred) override {
			if (ec && ec != beast::errc::not_connected) {
				error_callback(ec);
			}
			tcp_stream_->socket().shutdown(tcp::socket::shutdown_both, ec);
			if (ec && ec != beast::errc::not_connected) {
				error_callback(ec);
			}else {
				if(delegate_) delegate_->completion_callback(savanna::result<http::response<Body>>(std::move(response_)));
			}
		}